

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O1

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_deferred_queue
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this)

{
  mutex_type *__mutex;
  pointer ppVar1;
  test_fsm_observer *ptVar2;
  _Any_data *p_Var3;
  _Any_data *p_Var4;
  int iVar5;
  event_process_result eVar6;
  undefined8 uVar7;
  bool bVar8;
  event_queue deferred;
  priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
  local_58;
  
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->deferred_mutex_;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 != 0) {
LAB_00375b1a:
    uVar7 = std::__throw_system_error(iVar5);
    std::
    vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
    ::~vector(&local_58.c);
    _Unwind_Resume(uVar7);
  }
  p_Var3 = (_Any_data *)
           (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var4 = (_Any_data *)
           (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar1 = (this->deferred_events_).c.
           super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.c.
       super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.c.
       super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->deferred_events_).c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.c.
       super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var3;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
  local_58.c.
  super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (local_58.c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.c.
      super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ptVar2 != (test_fsm_observer *)0x0) {
        test::test_fsm_observer::
        start_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                  (ptVar2,this,
                   ((long)local_58.c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
      }
      if (local_58.c.
          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_58.c.
          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar8 = false;
      }
      else {
        do {
          if (*(long *)((long)local_58.c.
                              super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x10) == 0) {
            std::__throw_bad_function_call();
          }
          eVar6 = (**(code **)((long)local_58.c.
                                     super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x18))
                            ((_Any_data *)
                             local_58.c.
                             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          std::
          priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
          ::pop(&local_58);
          bVar8 = eVar6 == process;
        } while ((!bVar8) &&
                (local_58.c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_58.c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish));
      }
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar5 != 0) {
        iVar5 = std::__throw_system_error(iVar5);
        goto LAB_00375b1a;
      }
      while (local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ::push_back(&(this->deferred_events_).c,
                    local_58.c.
                    super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        std::
        push_heap<__gnu_cxx::__normal_iterator<std::pair<std::function<afsm::actions::event_process_result()>,int>*,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
                  ((this->deferred_events_).c.
                   super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->deferred_events_).c.
                   super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::
        priority_queue<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>::event_comparison>
        ::pop(&local_58);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      ptVar2 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (ptVar2 != (test_fsm_observer *)0x0) {
        test::test_fsm_observer::
        end_process_deferred_queue<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
                  (ptVar2,this,
                   ((long)(this->deferred_events_).c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->deferred_events_).c.
                          super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
      }
      if (bVar8) {
        p_Var3 = (_Any_data *)
                 (this->deferred_events_).c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var4 = (_Any_data *)
                 (this->deferred_events_).c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar1 = (this->deferred_events_).c.
                 super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this->deferred_events_).c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (this->deferred_events_).c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (this->deferred_events_).c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_58.c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var3;
        local_58.c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var4;
        local_58.c.
        super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
      }
    } while (local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_58.c.
             super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
  ::~vector(&local_58.c);
  return;
}

Assistant:

void
    process_deferred_queue()
    {
        using actions::event_process_result;
        event_queue deferred;
        {
            lock_guard lock{deferred_mutex_};
            ::std::swap(deferred_events_, deferred);
        }
        while (!deferred.empty()) {
            observer_wrapper::start_process_deferred_queue(*this, deferred.size());
            auto res = event_process_result::refuse;
            while (!deferred.empty()) {
                res = deferred.top().first();
                deferred.pop();
                if (res == event_process_result::process)
                    break;
            }
            {
                lock_guard lock{deferred_mutex_};
                while (!deferred.empty()) {
                    deferred_events_.push(deferred.top());
                    deferred.pop();
                }
            }
            observer_wrapper::end_process_deferred_queue(*this, deferred_events_.size());
            if (res == event_process_result::process) {
                ::std::swap(deferred_events_, deferred);
            }
        }
    }